

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.cpp
# Opt level: O2

int ZXing::Pdf417::Encoder::GetRecommendedMinimumErrorCorrectionLevel(int n)

{
  int iVar1;
  
  if (n < 0x29) {
    iVar1 = 2;
  }
  else if ((uint)n < 0xa1) {
    iVar1 = 3;
  }
  else {
    if (0x140 < (uint)n) {
      return 6 - (uint)((uint)n < 0x360);
    }
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

int
Encoder::GetRecommendedMinimumErrorCorrectionLevel(int n) {
	if (n <= 40) {
		return 2;
	}
	if (n <= 160) {
		return 3;
	}
	if (n <= 320) {
		return 4;
	}
	if (n <= 863) {
		return 5;
	}
	return 6;
}